

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_brusselator_1D_mri.c
# Opt level: O1

int Jf(sunrealtype t,N_Vector y,N_Vector fy,SUNMatrix Jac,void *user_data,N_Vector tmp1,
      N_Vector tmp2,N_Vector tmp3)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  
  lVar12 = *user_data;
  dVar2 = *(double *)((long)user_data + 0x28);
  lVar10 = N_VGetArrayPointer();
  if (lVar10 == 0) {
    Jf_cold_1();
    iVar9 = 1;
  }
  else {
    iVar9 = 0;
    if (0 < lVar12) {
      lVar6 = *(long *)((long)Jac->content + 0x28);
      lVar7 = *(long *)((long)Jac->content + 0x40);
      lVar11 = 0x10;
      do {
        dVar3 = *(double *)(lVar10 + -0x10 + lVar11);
        dVar4 = *(double *)(lVar10 + lVar11);
        lVar8 = *(long *)(lVar7 + -0x10 + lVar11);
        dVar5 = *(double *)(lVar10 + -8 + lVar11);
        pdVar1 = (double *)(lVar8 + lVar6 * 8);
        *pdVar1 = -(dVar4 + 1.0) + dVar5 * (dVar3 + dVar3);
        pdVar1[1] = dVar4 + dVar5 * -(dVar3 + dVar3);
        *(double *)(lVar8 + 0x10 + lVar6 * 8) = -dVar4;
        pdVar1 = (double *)(*(long *)(lVar7 + -8 + lVar11) + -8 + lVar6 * 8);
        *pdVar1 = dVar3 * dVar3;
        pdVar1[1] = -dVar3 * dVar3;
        lVar8 = *(long *)(lVar7 + lVar11);
        *(double *)(lVar8 + -0x10 + lVar6 * 8) = -dVar3;
        *(double *)(lVar8 + -8 + lVar6 * 8) = dVar3;
        *(double *)(lVar8 + lVar6 * 8) = -1.0 / dVar2 - dVar3;
        lVar11 = lVar11 + 0x18;
        lVar12 = lVar12 + -1;
        iVar9 = 0;
      } while (lVar12 != 0);
    }
  }
  return iVar9;
}

Assistant:

static int Jf(sunrealtype t, N_Vector y, N_Vector fy, SUNMatrix Jac,
              void* user_data, N_Vector tmp1, N_Vector tmp2, N_Vector tmp3)
{
  UserData udata = (UserData)user_data; /* access problem data */
  sunindextype N = udata->N;            /* set shortcuts */
  sunrealtype ep = udata->ep;
  sunindextype i;
  sunrealtype u, v, w;
  sunrealtype* Ydata = NULL;

  /* access solution array */
  Ydata = N_VGetArrayPointer(y);
  if (check_retval((void*)Ydata, "N_VGetArrayPointer", 0)) { return 1; }

  /* iterate over nodes, filling in Jacobian entries */
  for (i = 0; i < N; i++)
  {
    /* set nodal value shortcuts (shifted index due to start at first interior node) */
    u = Ydata[IDX(i, 0)];
    v = Ydata[IDX(i, 1)];
    w = Ydata[IDX(i, 2)];

    /* all vars wrt u */
    SM_ELEMENT_B(Jac, IDX(i, 0), IDX(i, 0)) = TWO * u * v - (w + ONE);
    SM_ELEMENT_B(Jac, IDX(i, 1), IDX(i, 0)) = w - TWO * u * v;
    SM_ELEMENT_B(Jac, IDX(i, 2), IDX(i, 0)) = -w;

    /* all vars wrt v */
    SM_ELEMENT_B(Jac, IDX(i, 0), IDX(i, 1)) = u * u;
    SM_ELEMENT_B(Jac, IDX(i, 1), IDX(i, 1)) = -u * u;

    /* all vars wrt w */
    SM_ELEMENT_B(Jac, IDX(i, 0), IDX(i, 2)) = -u;
    SM_ELEMENT_B(Jac, IDX(i, 1), IDX(i, 2)) = u;
    SM_ELEMENT_B(Jac, IDX(i, 2), IDX(i, 2)) = -ONE / ep - u;
  }

  /* return success */
  return (0);
}